

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction::IfcStructuralPlanarAction
          (IfcStructuralPlanarAction *this)

{
  *(undefined ***)&this->field_0x1a8 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0x1b0 = 0;
  *(char **)&this->field_0x1b8 = "IfcStructuralPlanarAction";
  IfcStructuralAction::IfcStructuralAction
            (&this->super_IfcStructuralAction,&PTR_construction_vtable_24__0079b148);
  *(undefined8 *)&(this->super_IfcStructuralAction).field_0x180 = 0;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject =
       0x79b018;
  *(undefined8 *)&this->field_0x1a8 = 0x79b130;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x88 = 0x79b040;
  (this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x79b068;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0x79b090;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.field_0x100 =
       0x79b0b8;
  *(undefined8 *)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.field_0x138 =
       0x79b0e0;
  *(undefined8 *)&(this->super_IfcStructuralAction).field_0x178 = 0x79b108;
  *(undefined1 **)&(this->super_IfcStructuralAction).field_0x188 = &this->field_0x198;
  *(undefined8 *)&this->field_0x190 = 0;
  this->field_0x198 = 0;
  return;
}

Assistant:

IfcStructuralPlanarAction() : Object("IfcStructuralPlanarAction") {}